

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

void __thiscall CLOptions::~CLOptions(CLOptions *this)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  undefined8 *in_RDI;
  iterator str_itr;
  iterator int_itr;
  iterator dbl_itr;
  iterator bool_itr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
  *in_stack_ffffffffffffff68;
  CLString *in_stack_ffffffffffffff70;
  CLDouble *in_stack_ffffffffffffff80;
  _Self local_68;
  _Base_ptr local_60;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
  local_58;
  _Self local_50;
  _Base_ptr local_48;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
  local_40;
  _Self local_38;
  _Base_ptr local_30;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
  local_28;
  _Self local_20;
  _Base_ptr local_18;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
  local_10 [2];
  
  *in_RDI = &PTR__CLOptions_0017b548;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
  ::_Rb_tree_iterator(local_10);
  local_18 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
             ::begin(in_stack_ffffffffffffff68);
  local_10[0]._M_node = local_18;
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
         ::end(in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(local_10,&local_20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                           *)0x13d105);
    if (ppVar2->second != (CLBool *)0x0) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                             *)0x13d119);
      if (ppVar2->second != (CLBool *)0x0) {
        (**(code **)(*(long *)ppVar2->second + 8))();
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                  *)in_stack_ffffffffffffff70);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
  ::_Rb_tree_iterator(&local_28);
  local_30 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                      *)in_stack_ffffffffffffff68);
  local_28._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                *)in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
                           *)0x13d19f);
    if (ppVar3->second != (CLDouble *)0x0) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
                             *)0x13d1b0);
      in_stack_ffffffffffffff80 = ppVar3->second;
      if (in_stack_ffffffffffffff80 != (CLDouble *)0x0) {
        (*(in_stack_ffffffffffffff80->super_CLParam<double>)._vptr_CLParam[1])();
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
                  *)in_stack_ffffffffffffff70);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
  ::_Rb_tree_iterator(&local_40);
  local_48 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
                      *)in_stack_ffffffffffffff68);
  local_40._M_node = local_48;
  while( true ) {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
                *)in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(&local_40,&local_50);
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
                           *)0x13d239);
    if (ppVar4->second != (CLInt *)0x0) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
                             *)0x13d24a);
      if (ppVar4->second != (CLInt *)0x0) {
        (**(code **)(*(long *)ppVar4->second + 8))();
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
                  *)in_stack_ffffffffffffff70);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
  ::_Rb_tree_iterator(&local_58);
  local_60 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                      *)in_stack_ffffffffffffff68);
  local_58._M_node = local_60;
  while( true ) {
    local_68._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                *)in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(&local_58,&local_68);
    if (!bVar1) break;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
                           *)0x13d2d3);
    if (ppVar5->second != (CLString *)0x0) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
                             *)0x13d2e4);
      in_stack_ffffffffffffff70 = ppVar5->second;
      if (in_stack_ffffffffffffff70 != (CLString *)0x0) {
        (*(in_stack_ffffffffffffff70->
          super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )._vptr_CLParam[1])();
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
                  *)in_stack_ffffffffffffff70);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 0x3f));
  CLString::~CLString((CLString *)0x13d330);
  std::__cxx11::string::~string((string *)(in_RDI + 0x28));
  std::__cxx11::string::~string((string *)(in_RDI + 0x24));
  std::__cxx11::string::~string((string *)(in_RDI + 0x20));
  std::__cxx11::string::~string((string *)(in_RDI + 0x1c));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
          *)0x13d385);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
          *)0x13d396);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
          *)0x13d3a4);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
          *)0x13d3b2);
  std::vector<option,_std::allocator<option>_>::~vector
            ((vector<option,_std::allocator<option>_> *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

virtual ~CLOptions()
    {
        // Loop through each storage map and delete all objects
        std::map<std::string, CLBool*>::iterator bool_itr ;
        for (bool_itr=params_bools.begin(); bool_itr!=params_bools.end(); ++bool_itr)
            if (bool_itr->second != 0) delete bool_itr->second ;
        
        std::map<std::string, CLDouble*>::iterator dbl_itr;
        for (dbl_itr=params_doubles.begin(); dbl_itr!=params_doubles.end(); ++dbl_itr)
            if (dbl_itr->second != 0) delete dbl_itr->second ;
        
        std::map<std::string, CLInt*>::iterator int_itr;
        for (int_itr=params_ints.begin(); int_itr!=params_ints.end(); ++int_itr)
            if (int_itr->second != 0) delete int_itr->second ;
        
        std::map<std::string, CLString*>::iterator str_itr ;
        for (str_itr=params_strings.begin(); str_itr!=params_strings.end(); ++str_itr)
            if (str_itr->second != 0) delete str_itr->second ;
    }